

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2ee56::DryRunCommandRunner::StartCommand(DryRunCommandRunner *this,Edge *edge)

{
  Edge *local_8;
  
  local_8 = edge;
  std::deque<Edge_*,_std::allocator<Edge_*>_>::push_back(&(this->finished_).c,&local_8);
  return true;
}

Assistant:

bool DryRunCommandRunner::StartCommand(Edge* edge) {
  finished_.push(edge);
  return true;
}